

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ZSTDMT_CCtx *mtctx_local;
  
  if (mtctx == (ZSTDMT_CCtx *)0x0) {
    mtctx_local = (ZSTDMT_CCtx *)0x0;
  }
  else {
    sVar2 = POOL_sizeof(mtctx->factory);
    sVar3 = ZSTDMT_sizeof_bufferPool(mtctx->bufPool);
    uVar1 = mtctx->jobIDMask;
    sVar4 = ZSTDMT_sizeof_CCtxPool(mtctx->cctxPool);
    sVar5 = ZSTDMT_sizeof_seqPool(mtctx->seqPool);
    sVar6 = ZSTD_sizeof_CDict(mtctx->cdictLocal);
    mtctx_local = (ZSTDMT_CCtx *)
                  (sVar2 + 0x380 + sVar3 + (ulong)(uVar1 + 1) * 0x178 + sVar4 + sVar5 + sVar6 +
                  (mtctx->roundBuff).capacity);
  }
  return (size_t)mtctx_local;
}

Assistant:

size_t ZSTDMT_sizeof_CCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx == NULL) return 0;   /* supports sizeof NULL */
    return sizeof(*mtctx)
            + POOL_sizeof(mtctx->factory)
            + ZSTDMT_sizeof_bufferPool(mtctx->bufPool)
            + (mtctx->jobIDMask+1) * sizeof(ZSTDMT_jobDescription)
            + ZSTDMT_sizeof_CCtxPool(mtctx->cctxPool)
            + ZSTDMT_sizeof_seqPool(mtctx->seqPool)
            + ZSTD_sizeof_CDict(mtctx->cdictLocal)
            + mtctx->roundBuff.capacity;
}